

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t *psVar1;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  int iVar4;
  SectionTracker *pSVar5;
  undefined4 extraout_var;
  IMutableContext *pIVar6;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_318;
  string local_2f8;
  Totals local_2d8;
  TestCaseInfo local_2a0;
  TestCaseStats local_1a8;
  
  local_2d8.assertions.passed = (this->m_totals).assertions.passed;
  local_2d8.assertions.failed = (this->m_totals).assertions.failed;
  local_2d8.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_2d8.testCases.passed = (this->m_totals).testCases.passed;
  local_2d8.testCases.failed = (this->m_totals).testCases.failed;
  local_2d8.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2a0,&testCase->super_TestCaseInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar2,&local_2a0);
  this->m_activeTestCase = testCase;
  do {
    pSVar5 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    iVar4 = (*(pSVar5->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.
              super_IShared.super_NonCopyable._vptr_NonCopyable[0x10])(pSVar5);
    if ((char)iVar4 == '\0') {
      __assert_fail("rootTracker.isSectionTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/effolkronium[P]random/test/catch.hpp"
                    ,0x19cb,"Totals Catch::RunContext::runTest(const TestCase &)");
    }
    iVar4 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x11])();
    TestCaseTracking::SectionTracker::addInitialFilters
              (pSVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var,iVar4));
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      std::__cxx11::string::string((string *)&local_1a8,(string *)&local_2a0);
      local_1a8.testInfo.name.field_2._8_8_ = local_2a0.lineInfo.file;
      local_1a8.testInfo.className._M_dataplus._M_p = (pointer)local_2a0.lineInfo.line;
      pSVar5 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(NameAndLocation *)&local_1a8);
      this->m_testCaseTracker = (ITracker *)pSVar5;
      std::__cxx11::string::~string((string *)&local_1a8);
      runCurrentTest(this,&local_2f8,&local_318);
      iVar4 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar4 != '\0') break;
      iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
    } while ((char)iVar4 == '\0');
    pIVar6 = getCurrentMutableContext();
    iVar4 = (*(pIVar6->super_IContext)._vptr_IContext[5])(pIVar6);
    if ((char)iVar4 == '\0') break;
    iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
  } while ((char)iVar4 == '\0');
  Totals::delta(__return_storage_ptr__,&this->m_totals,&local_2d8);
  sVar3 = (__return_storage_ptr__->testCases).passed;
  if ((sVar3 != 0 & (byte)(undefined1)local_2a0.properties >> 2) == 1) {
    psVar1 = &(__return_storage_ptr__->assertions).failed;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->testCases).passed = sVar3 - 1;
    psVar1 = &(__return_storage_ptr__->testCases).failed;
    *psVar1 = *psVar1 + 1;
  }
  Counts::operator+=(&(this->m_totals).testCases,&__return_storage_ptr__->testCases);
  pIVar2 = (this->m_reporter).m_p;
  iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xc])(this);
  TestCaseStats::TestCaseStats
            (&local_1a8,&local_2a0,__return_storage_ptr__,&local_2f8,&local_318,SUB41(iVar4,0));
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_1a8);
  TestCaseStats::~TestCaseStats(&local_1a8);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo(&local_2a0);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                ITracker& rootTracker = m_trackerContext.startRun();
                assert( rootTracker.isSectionTracker() );
                static_cast<SectionTracker&>( rootTracker ).addInitialFilters( m_config->getSectionsToRun() );
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, TestCaseTracking::NameAndLocation( testInfo.name, testInfo.lineInfo ) );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }